

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise1d.cpp
# Opt level: O3

int __thiscall
ncnn::DeconvolutionDepthWise1D::forward
          (DeconvolutionDepthWise1D *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint kernel_w;
  int iVar1;
  Mat *top_blob;
  int *piVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  ulong uVar8;
  Allocator **ppAVar9;
  int _h;
  int iVar10;
  ulong uVar11;
  void *pvVar12;
  void *pvVar13;
  void *pvVar14;
  void *pvVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  long lVar21;
  Option *in_stack_fffffffffffffe48;
  Mat local_198;
  pointer local_150;
  long local_148;
  Option *local_140;
  Mat *local_138;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_130;
  void *local_128;
  void *local_120;
  Mat local_118;
  Mat local_c8;
  Mat local_78;
  
  local_150 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
  top_blob = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
  iVar7 = local_150->h;
  _h = this->group * local_150[1].h;
  kernel_w = local_150[1].w;
  uVar19 = (ulong)kernel_w;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  local_130 = bottom_blobs;
  flatten(local_150 + 1,&local_78,opt);
  iVar20 = -100;
  if ((local_78.data == (void *)0x0) || ((long)local_78.c * local_78.cstep == 0)) goto LAB_00557c2b;
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8._20_8_ = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  Mat::create(&local_c8,(int)(kernel_w * iVar7 * _h) / this->group,4,opt->workspace_allocator);
  iVar20 = -100;
  local_120 = local_c8.data;
  if ((local_c8.data != (void *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
    iVar20 = this->group;
    local_148 = (long)iVar20;
    if (0 < local_148) {
      uVar18 = (long)iVar7 / (long)iVar20;
      uVar11 = uVar18 & 0xffffffff;
      uVar8 = (long)_h / (long)iVar20 & 0xffffffff;
      local_128 = local_78.data;
      iVar10 = (int)uVar18;
      iVar7 = (int)((long)_h / (long)iVar20);
      iVar20 = 0;
      lVar21 = 0;
      do {
        if (0 < iVar7) {
          pvVar15 = (void *)((long)local_c8.data + (long)iVar20 * 4);
          pvVar12 = (void *)((long)local_78.data + (long)iVar20 * 4);
          uVar18 = 0;
          do {
            if (0 < iVar10) {
              uVar16 = 0;
              pvVar13 = pvVar15;
              pvVar14 = pvVar12;
              do {
                if (0 < (int)kernel_w) {
                  uVar17 = 0;
                  do {
                    *(undefined4 *)((long)pvVar13 + uVar17 * 4) =
                         *(undefined4 *)((long)pvVar14 + uVar17 * 4);
                    uVar17 = uVar17 + 1;
                  } while (uVar19 != uVar17);
                }
                uVar16 = uVar16 + 1;
                pvVar13 = (void *)((long)pvVar13 + uVar19 * 4);
                pvVar14 = (void *)((long)pvVar14 + uVar19 * uVar8 * 4);
              } while (uVar16 != uVar11);
            }
            uVar18 = uVar18 + 1;
            pvVar15 = (void *)((long)pvVar15 + uVar19 * uVar11 * 4);
            pvVar12 = (void *)((long)pvVar12 + uVar19 * 4);
          } while (uVar18 != uVar8);
        }
        lVar21 = lVar21 + 1;
        iVar20 = iVar20 + iVar10 * kernel_w * iVar7;
      } while (lVar21 != local_148);
    }
    local_118.cstep = 0;
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize._0_4_ = 0;
    local_118._20_8_ = 0;
    local_118.allocator = (Allocator *)0x0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    local_140 = opt;
    local_138 = top_blob;
    if (this->bias_term == 0) {
LAB_005579a8:
      ppAVar9 = &opt->workspace_allocator;
      iVar7 = this->dilation_w;
      iVar20 = local_150->w;
      iVar10 = this->stride_w;
      iVar1 = this->output_pad_right;
      local_198.cstep = 0;
      local_198.data = (void *)0x0;
      local_198.refcount._0_4_ = 0;
      local_198.refcount._4_4_ = 0;
      local_198.elemsize._0_4_ = 0;
      local_198.elemsize._4_4_ = 0;
      local_198.elempack = 0;
      local_198.allocator = (Allocator *)0x0;
      local_198.dims = 0;
      local_198.w = 0;
      local_198.h = 0;
      local_198.d = 0;
      local_198.c = 0;
      if ((this->pad_left < 1) && ((this->pad_right < 1 && (this->output_w < 1)))) {
        if (&local_198 != top_blob) {
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + 1;
            UNLOCK();
          }
          local_198.data = top_blob->data;
          local_198.refcount._0_4_ = SUB84(top_blob->refcount,0);
          local_198.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
          local_198.elemsize._0_4_ = (undefined4)top_blob->elemsize;
          local_198.elemsize._4_4_ = (undefined4)(top_blob->elemsize >> 0x20);
          local_198.elempack = top_blob->elempack;
          local_198.allocator = top_blob->allocator;
          uVar3 = top_blob->dims;
          uVar4 = top_blob->w;
          uVar5 = top_blob->h;
          uVar6 = top_blob->d;
          local_198.c = top_blob->c;
          local_198.cstep = top_blob->cstep;
          local_198.dims = uVar3;
          local_198.w = uVar4;
          local_198.h = uVar5;
          local_198.d = uVar6;
        }
        ppAVar9 = &opt->blob_allocator;
      }
      Mat::create(&local_198,iVar1 + (kernel_w - 1) * iVar7 + (iVar20 + -1) * iVar10 + 1,_h,4,
                  *ppAVar9);
      iVar20 = -100;
      if ((local_198.data != (void *)0x0) && ((long)local_198.c * local_198.cstep != 0)) {
        deconvolutiondepthwise1d
                  (local_150,&local_198,&local_c8,&local_118,kernel_w,this->stride_w,
                   this->dilation_w,this->group,this->activation_type,&this->activation_params,
                   in_stack_fffffffffffffe48);
        cut_padding(this,&local_198,top_blob,opt);
        if ((top_blob->data == (void *)0x0) ||
           (iVar20 = 0, (long)top_blob->c * top_blob->cstep == 0)) {
          iVar20 = -100;
        }
      }
      piVar2 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_198.allocator == (Allocator *)0x0) {
            if (local_198.data != (void *)0x0) {
              free(local_198.data);
            }
          }
          else {
            (*(local_198.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      flatten((local_130->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start + 2,&local_118,opt);
      iVar20 = -100;
      if ((local_118.data != (void *)0x0) && ((long)local_118.c * local_118.cstep != 0))
      goto LAB_005579a8;
    }
    piVar2 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          if (local_118.data != (void *)0x0) {
            free(local_118.data);
          }
        }
        else {
          (*(local_118.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  piVar2 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_00557c2b:
  piVar2 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar20;
}

Assistant:

int DeconvolutionDepthWise1D::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _num_input = bottom_blob.h;
    const int _kernel_w = _weight_data.w;
    const int _num_output = _weight_data.h * group;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    // transpose group-inch/group-outch/group-kw to group-outch/group-inch/group-kw
    Mat weight_data_transposed;
    {
        weight_data_transposed.create(_kernel_w * _num_output * _num_input / group, 4u, opt.workspace_allocator);
        if (weight_data_transposed.empty())
            return -100;

        const int outch_g = _num_output / group;
        const int inch_g = _num_input / group;
        const int maxk = _kernel_w;

        for (int g = 0; g < group; g++)
        {
            // reorder weight from inch-outch to outch-inch
            float* wg2 = (float*)weight_data_transposed + g * outch_g * inch_g * maxk;
            const float* wg = (const float*)weight_data_flattened + g * inch_g * outch_g * maxk;
            for (int i = 0; i < outch_g; i++)
            {
                for (int j = 0; j < inch_g; j++)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        wg2[(i * inch_g + j) * maxk + k] = wg[(j * outch_g + i) * maxk + k];
                    }
                }
            }
        }
    }

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;
    }

    const int w = bottom_blob.w;

    const int kernel_extent_w = dilation_w * (_kernel_w - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || output_w > 0)
    {
        top_blob_bordered.create(outw, _num_output, 4u, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, _num_output, 4u, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolutiondepthwise1d(bottom_blob, top_blob_bordered, weight_data_transposed, bias_data_flattened, _kernel_w, stride_w, dilation_w, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}